

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

size_t __thiscall sentencepiece::SelfTestData_Sample::ByteSizeLong(SelfTestData_Sample *this)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) == 0) {
    sVar4 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->input_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar4 = sVar4 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->expected_).tagged_ptr_.ptr_ & 0xfffffffffffffffe))
      ;
      sVar4 = sVar4 + sVar3 + 1;
    }
  }
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    sVar4 = sVar4 + *(long *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar4;
  return sVar4;
}

Assistant:

size_t SelfTestData_Sample::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SelfTestData.Sample)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string input = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input());
    }

    // optional string expected = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_expected());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}